

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O1

void __thiscall libcellml::XmlDoc::parseMathML(XmlDoc *this,string *input)

{
  long lVar1;
  xmlDocPtr pxVar2;
  undefined8 uVar3;
  long *local_38 [2];
  long local_28 [2];
  
  if (parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_ == '\0') {
    parseMathML();
  }
  if (parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_._M_string_length == 0) {
    decompressMathMLDTD_abi_cxx11_();
    std::__cxx11::string::operator=
              ((string *)&parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_,
               (string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  xmlInitParser();
  lVar1 = xmlNewParserCtxt();
  *(XmlDoc **)(lVar1 + 0x1a8) = this;
  xmlSetStructuredErrorFunc(lVar1,structuredErrorCallback);
  pxVar2 = (xmlDocPtr)xmlCtxtReadDoc(lVar1,(input->_M_dataplus)._M_p,"/",0,0);
  this->mPimpl->mXmlDocPtr = pxVar2;
  uVar3 = xmlParserInputBufferCreateMem
                    (parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_._M_dataplus._M_p
                     ,0x5f8a8,0x16);
  uVar3 = xmlIOParseDTD(0,uVar3,0x16);
  xmlValidateDtd(lVar1 + 0xa0,this->mPimpl->mXmlDocPtr,uVar3);
  xmlFreeDtd(uVar3);
  xmlFreeParserCtxt(lVar1);
  xmlSetStructuredErrorFunc(0,0);
  xmlCleanupParser();
  return;
}

Assistant:

void XmlDoc::parseMathML(const std::string &input)
{
    // Decompress the MathML DTD.
    int sizeMathmlDTDUncompressed = MATHML_DTD_LEN;

    static std::string mathMLDTD;

    if (mathMLDTD.empty()) {
        mathMLDTD = decompressMathMLDTD();
    }

    xmlInitParser();
    xmlParserCtxtPtr context = xmlNewParserCtxt();
    context->_private = reinterpret_cast<void *>(this);
    xmlSetStructuredErrorFunc(context, structuredErrorCallback);
    mPimpl->mXmlDocPtr = xmlCtxtReadDoc(context, reinterpret_cast<const xmlChar *>(input.c_str()), "/", nullptr, 0);
    xmlParserInputBufferPtr buf = xmlParserInputBufferCreateMem(reinterpret_cast<const char *>(mathMLDTD.c_str()), sizeMathmlDTDUncompressed, XML_CHAR_ENCODING_ASCII);
    xmlDtdPtr dtd = xmlIOParseDTD(nullptr, buf, XML_CHAR_ENCODING_ASCII);
    xmlValidateDtd(&(context->vctxt), mPimpl->mXmlDocPtr, dtd);

    xmlFreeDtd(dtd);
    xmlFreeParserCtxt(context);
    xmlSetStructuredErrorFunc(nullptr, nullptr);
    xmlCleanupParser();
}